

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EfiTianoCompressLegacy.c
# Opt level: O2

void InsertNode(void)

{
  int iVar1;
  UINT8 *pUVar2;
  NODE_conflict *pNVar3;
  NODE_conflict *pNVar4;
  NODE_conflict Parent;
  uint NodeQ;
  uint uVar5;
  uint uVar6;
  NODE_conflict NVar7;
  uint NodeQ_00;
  UINT8 UVar8;
  int iVar9;
  long lVar10;
  long lVar11;
  int iVar12;
  
  NVar7 = mPos;
  pNVar4 = mParent;
  pNVar3 = mPosition;
  if (mMatchLen < 4) {
    NodeQ_00 = mText[mPos] | 0x80000;
    UVar8 = mText[(long)mPos + 1];
    NodeQ = Child(NodeQ_00,UVar8);
    if (NodeQ == 0) {
      MakeChild(NodeQ_00,UVar8,mPos);
      mMatchLen = 1;
      return;
    }
    mMatchLen = 2;
    iVar12 = 2;
  }
  else {
    iVar12 = mMatchLen + -1;
    NodeQ = mMatchPos + 1U | 0x80000;
    while( true ) {
      uVar5 = mParent[(int)NodeQ];
      if (mParent[(int)NodeQ] != 0) break;
      NodeQ = mNext[(int)NodeQ];
    }
    while (NodeQ_00 = uVar5, uVar5 = NodeQ_00, mMatchLen = iVar12,
          iVar12 <= (int)(uint)mLevel[(int)NodeQ_00]) {
      uVar5 = mParent[(int)NodeQ_00];
      NodeQ = NodeQ_00;
    }
    for (; pNVar3[(int)uVar5] < 0; uVar5 = pNVar4[(int)uVar5]) {
      pNVar3[(int)uVar5] = NVar7;
    }
    if ((int)uVar5 < 0x80000) {
      pNVar3[(int)uVar5] = NVar7 | 0x80000000;
    }
  }
  while( true ) {
    Parent = mAvail;
    NVar7 = mPos;
    pNVar4 = mNext;
    pNVar3 = mPrev;
    pUVar2 = mText;
    uVar6 = 0x100;
    uVar5 = NodeQ;
    if ((int)NodeQ < 0x80000) {
      uVar6 = (uint)mLevel[(int)NodeQ];
      uVar5 = mPosition[(int)NodeQ] & 0x7fffffff;
    }
    if (mPos <= (int)uVar5) {
      uVar5 = uVar5 - 0x80000;
    }
    lVar10 = (long)mPos;
    iVar9 = iVar12 + mPos;
    for (lVar11 = 0; iVar1 = (int)lVar11, mMatchPos = uVar5, iVar12 + iVar1 < (int)uVar6;
        lVar11 = lVar11 + 1) {
      if (mText[lVar11 + iVar9] != mText[lVar11 + (int)(uVar5 + iVar12)]) {
        lVar10 = (long)mAvail;
        mAvail = mNext[lVar10];
        mChildCount[lVar10] = '\0';
        pNVar3 = mPrev;
        iVar9 = mPrev[(int)NodeQ];
        mPrev[lVar10] = iVar9;
        pNVar4[iVar9] = Parent;
        iVar9 = pNVar4[(int)NodeQ];
        pNVar4[lVar10] = iVar9;
        pNVar3[iVar9] = Parent;
        mParent[lVar10] = mParent[(int)NodeQ];
        iVar12 = iVar12 + iVar1;
        mLevel[lVar10] = (UINT8)iVar12;
        mPosition[lVar10] = NVar7;
        MakeChild(Parent,pUVar2[(int)(uVar5 + iVar12)],NodeQ);
        UVar8 = pUVar2[iVar12 + NVar7];
        NodeQ = Parent;
        goto LAB_00174856;
      }
      mMatchLen = iVar12 + iVar1 + 1;
    }
    if (0xff < iVar12 + iVar1) {
      iVar12 = mPrev[(int)NodeQ];
      mPrev[lVar10] = iVar12;
      pNVar4 = mNext;
      mNext[iVar12] = NVar7;
      iVar12 = pNVar4[(int)NodeQ];
      pNVar4[lVar10] = iVar12;
      pNVar3[iVar12] = NVar7;
      pNVar3 = mParent;
      mParent[lVar10] = NodeQ_00;
      pNVar3[(int)NodeQ] = 0;
      pNVar4[(int)NodeQ] = NVar7;
      return;
    }
    mPosition[(int)NodeQ] = mPos;
    uVar5 = Child(NodeQ,pUVar2[lVar11 + iVar9]);
    if (uVar5 == 0) break;
    mMatchLen = mMatchLen + 1;
    NodeQ_00 = NodeQ;
    iVar12 = mMatchLen;
    NodeQ = uVar5;
  }
  UVar8 = pUVar2[lVar11 + iVar9];
  NVar7 = mPos;
LAB_00174856:
  MakeChild(NodeQ,UVar8,NVar7);
  return;
}

Assistant:

STATIC
  VOID
  InsertNode (
  VOID
  )
  /*++

  Routine Description:

  Insert string info for current position into the String Info Log

  Arguments: (VOID)

  Returns: (VOID)

  --*/
{
  NODE  NodeQ;
  NODE  NodeR;
  NODE  Index2;
  NODE  NodeT;
  UINT8 CharC;
  UINT8 *t1;
  UINT8 *t2;

  if (mMatchLen >= 4) {
    //
    // We have just got a long match, the target tree
    // can be located by MatchPos + 1. Traverse the tree
    // from bottom up to get to a proper starting point.
    // The usage of PERC_FLAG ensures proper node deletion
    // DeleteNode() later.
    //
    mMatchLen--;
    NodeR = (NODE) ((mMatchPos + 1) | WNDSIZ);
    NodeQ = mParent[NodeR];
    while (NodeQ == NIL) {
      NodeR = mNext[NodeR];
      NodeQ = mParent[NodeR];
    }

    while (mLevel[NodeQ] >= mMatchLen) {
      NodeR = NodeQ;
      NodeQ = mParent[NodeQ];
    }

    NodeT = NodeQ;
    while (mPosition[NodeT] < 0) {
      mPosition[NodeT]  = mPos;
      NodeT             = mParent[NodeT];
    }

        if (NodeT < (NODE) WNDSIZ) {
      mPosition[NodeT] = (NODE) (mPos | (UINT32) PERC_FLAG);
    }
  } else {
    //
    // Locate the target tree
    //
    NodeQ = (NODE) (mText[mPos] + WNDSIZ);
    CharC = mText[mPos + 1];
    NodeR = Child (NodeQ, CharC);
    if (NodeR == NIL) {
      MakeChild (NodeQ, CharC, mPos);
      mMatchLen = 1;
      return ;
    }

    mMatchLen = 2;
  }
  //
  // Traverse down the tree to find a match.
  // Update Position value along the route.
  // Node split or creation is involved.
  //
  for (;;) {
        if (NodeR >= (NODE) WNDSIZ) {
      Index2    = MAXMATCH;
      mMatchPos = NodeR;
    } else {
      Index2    = mLevel[NodeR];
      mMatchPos = (NODE) (mPosition[NodeR] & (UINT32)~PERC_FLAG);
    }

    if (mMatchPos >= mPos) {
      mMatchPos -= WNDSIZ;
    }

    t1  = &mText[mPos + mMatchLen];
    t2  = &mText[mMatchPos + mMatchLen];
    while (mMatchLen < Index2) {
      if (*t1 != *t2) {
        Split (NodeR);
        return ;
      }

      mMatchLen++;
      t1++;
      t2++;
    }

    if (mMatchLen >= MAXMATCH) {
      break;
    }

    mPosition[NodeR]  = mPos;
    NodeQ             = NodeR;
    NodeR             = Child (NodeQ, *t1);
    if (NodeR == NIL) {
      MakeChild (NodeQ, *t1, mPos);
      return ;
    }

    mMatchLen++;
  }

  NodeT           = mPrev[NodeR];
  mPrev[mPos]     = NodeT;
  mNext[NodeT]    = mPos;
  NodeT           = mNext[NodeR];
  mNext[mPos]     = NodeT;
  mPrev[NodeT]    = mPos;
  mParent[mPos]   = NodeQ;
  mParent[NodeR]  = NIL;

  //
  // Special usage of 'next'
  //
  mNext[NodeR] = mPos;

}